

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnetconfig.c
# Opt level: O0

void * setnetconfig(void)

{
  int *piVar1;
  netconfig_vars *nc_vars;
  
  nc_vars = (netconfig_vars *)
            (*__ntirpc_pkg_params.calloc_)
                      (1,0x10,
                       "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/getnetconfig.c"
                       ,0xbd,"setnetconfig");
  pthread_mutex_lock((pthread_mutex_t *)&nc_mtx);
  ni.ref = ni.ref + 1;
  if ((nc_file == (FILE *)0x0) &&
     (nc_file = (FILE *)fopen("/etc/netconfig","r"), (FILE *)nc_file == (FILE *)0x0)) {
    ni.ref = ni.ref + -1;
    pthread_mutex_unlock((pthread_mutex_t *)&nc_mtx);
    piVar1 = __nc_error();
    *piVar1 = 2;
    mem_free(nc_vars,0x10);
    nc_vars = (netconfig_vars *)0x0;
  }
  else {
    nc_vars->valid = 0xfeed;
    nc_vars->flag = 0;
    nc_vars->nc_configs = ni.head;
    pthread_mutex_unlock((pthread_mutex_t *)&nc_mtx);
  }
  return nc_vars;
}

Assistant:

void *
setnetconfig(void)
{
	struct netconfig_vars *nc_vars = (struct netconfig_vars *)
		mem_zalloc(sizeof(struct netconfig_vars));

	/*
	 * For multiple calls, i.e. nc_file is not NULL, we just return the
	 * handle without reopening the netconfig db.
	 */
	mutex_lock(&nc_mtx);
	ni.ref++;

	if (!nc_file) {
		nc_file = fopen(NETCONFIG, "r");
		if (!nc_file) {
			ni.ref--;
			mutex_unlock(&nc_mtx);
			nc_error = NC_NONETCONFIG;
			mem_free(nc_vars, sizeof(*nc_vars));
			return (NULL);
		}
	}
	nc_vars->valid = NC_VALID;
	nc_vars->flag = 0;
	nc_vars->nc_configs = ni.head;
	mutex_unlock(&nc_mtx);
	return ((void *)nc_vars);
}